

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeSubpattern
          (ParsedPatternInfo *this,UErrorCode *status)

{
  consumePadding(this,UNUM_PAD_BEFORE_PREFIX,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    consumeAffix(this,&this->currentSubpattern->prefixEndpoints,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      consumePadding(this,UNUM_PAD_AFTER_PREFIX,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        consumeFormat(this,status);
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          consumeExponent(this,status);
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            consumePadding(this,UNUM_PAD_BEFORE_SUFFIX,status);
            if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
              consumeAffix(this,&this->currentSubpattern->suffixEndpoints,status);
              if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                consumePadding(this,UNUM_PAD_AFTER_SUFFIX,status);
                return;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumeSubpattern(UErrorCode& status) {
    // subpattern := literals? number exponent? literals?
    consumePadding(PadPosition::UNUM_PAD_BEFORE_PREFIX, status);
    if (U_FAILURE(status)) { return; }
    consumeAffix(currentSubpattern->prefixEndpoints, status);
    if (U_FAILURE(status)) { return; }
    consumePadding(PadPosition::UNUM_PAD_AFTER_PREFIX, status);
    if (U_FAILURE(status)) { return; }
    consumeFormat(status);
    if (U_FAILURE(status)) { return; }
    consumeExponent(status);
    if (U_FAILURE(status)) { return; }
    consumePadding(PadPosition::UNUM_PAD_BEFORE_SUFFIX, status);
    if (U_FAILURE(status)) { return; }
    consumeAffix(currentSubpattern->suffixEndpoints, status);
    if (U_FAILURE(status)) { return; }
    consumePadding(PadPosition::UNUM_PAD_AFTER_SUFFIX, status);
    if (U_FAILURE(status)) { return; }
}